

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O0

duk_ret_t dukglue::detail::MethodInfo<false,_Circle,_int>::MethodRuntime::finalize_method
                    (duk_context *ctx)

{
  void *pvVar1;
  MethodHolder *method_holder;
  void *method_holder_void;
  duk_context *ctx_local;
  
  duk_get_prop_string(ctx,0,anon_var_dwarf_da1a);
  pvVar1 = duk_require_pointer(ctx,-1);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,0x10);
  }
  return 0;
}

Assistant:

static duk_ret_t finalize_method(duk_context* ctx)
				{
					// clean up the MethodHolder reference
					duk_get_prop_string(ctx, 0, "\xFF" "method_holder");

					void* method_holder_void = duk_require_pointer(ctx, -1);
					MethodHolder* method_holder = static_cast<MethodHolder*>(method_holder_void);
					delete method_holder;

					return 0;
				}